

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flag_complex_edge_collapser.h
# Opt level: O3

void __thiscall
Gudhi::collapse::Flag_complex_edge_collapser<int,float>::
read_edges<std::vector<std::tuple<int,int,float>,std::allocator<std::tuple<int,int,float>>>>
          (Flag_complex_edge_collapser<int,float> *this,
          vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_> *r)

{
  pointer pvVar1;
  int iVar2;
  pointer ptVar3;
  ulong uVar4;
  pointer ppVar5;
  pointer ptVar6;
  int u;
  int v;
  float f;
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  neighbors_seq;
  ulong local_80;
  int local_74;
  long local_70;
  _Head_base<2UL,_float,_false> local_64;
  pointer local_60;
  vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>
  local_58 [8];
  pointer local_50;
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  local_48;
  
  std::
  vector<boost::container::flat_map<int,_float,_std::less<int>,_void>,_std::allocator<boost::container::flat_map<int,_float,_std::less<int>,_void>_>_>
  ::resize((vector<boost::container::flat_map<int,_float,_std::less<int>,_void>,_std::allocator<boost::container::flat_map<int,_float,_std::less<int>,_void>_>_>
            *)this,*(size_type *)(this + 0x18));
  std::
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  ::vector(&local_48,*(size_type *)(this + 0x18),(allocator_type *)&local_70);
  ptVar6 = (r->
           super__Vector_base<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ptVar3 = (r->
           super__Vector_base<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar6 != ptVar3) {
    do {
      iVar2 = (ptVar6->super__Tuple_impl<0UL,_int,_int,_float>).super__Head_base<0UL,_int,_false>.
              _M_head_impl;
      local_80 = CONCAT44(local_80._4_4_,iVar2);
      local_74 = (ptVar6->super__Tuple_impl<0UL,_int,_int,_float>).
                 super__Tuple_impl<1UL,_int,_float>.super__Head_base<1UL,_int,_false>._M_head_impl;
      local_64._M_head_impl =
           (ptVar6->super__Tuple_impl<0UL,_int,_int,_float>).super__Tuple_impl<1UL,_int,_float>.
           super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl;
      pvVar1 = local_48.
               super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar2;
      uVar4 = (pvVar1->m_holder).m_size;
      if (uVar4 < (pvVar1->m_holder).m_capacity) {
        ppVar5 = (pvVar1->m_holder).m_start;
        ppVar5[uVar4].first = local_74;
        ppVar5[uVar4].second = local_64._M_head_impl;
        (pvVar1->m_holder).m_size = uVar4 + 1;
      }
      else {
        local_50 = (pvVar1->m_holder).m_start + uVar4;
        boost::container::
        vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>::
        priv_forward_range_insert_no_capacity<boost::container::dtl::insert_emplace_proxy<boost::container::new_allocator<std::pair<int,float>>,std::pair<int,float>*,int&,float&>>
                  ((vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>
                    *)&local_70,pvVar1,&local_50,1,&local_64,&local_74);
        if (local_70 == 0) goto LAB_0010d0dd;
      }
      pvVar1 = local_48.
               super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_74;
      uVar4 = (pvVar1->m_holder).m_size;
      if (uVar4 < (pvVar1->m_holder).m_capacity) {
        ppVar5 = (pvVar1->m_holder).m_start;
        ppVar5[uVar4].first = (int)local_80;
        ppVar5[uVar4].second = local_64._M_head_impl;
        (pvVar1->m_holder).m_size = uVar4 + 1;
      }
      else {
        local_60 = (pvVar1->m_holder).m_start + uVar4;
        boost::container::
        vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>::
        priv_forward_range_insert_no_capacity<boost::container::dtl::insert_emplace_proxy<boost::container::new_allocator<std::pair<int,float>>,std::pair<int,float>*,int&,float&>>
                  (local_58,pvVar1,&local_60,1,&local_64,&local_80);
        read_edges<std::vector<std::tuple<int,int,float>,std::allocator<std::tuple<int,int,float>>>>
                  ((Flag_complex_edge_collapser<int,float> *)local_58);
      }
      ptVar6 = ptVar6 + 1;
    } while (ptVar6 != ptVar3);
  }
  local_80 = 0;
  if (local_48.
      super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pvVar1 = local_48.
               super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_80;
      local_74 = -0x800000;
      uVar4 = (pvVar1->m_holder).m_size;
      if (uVar4 < (pvVar1->m_holder).m_capacity) {
        ppVar5 = (pvVar1->m_holder).m_start;
        ppVar5[uVar4].first = (int)local_80;
        ppVar5[uVar4].second = -INFINITY;
        (pvVar1->m_holder).m_size = uVar4 + 1;
      }
      else {
        local_50 = (pvVar1->m_holder).m_start + uVar4;
        boost::container::
        vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>::
        priv_forward_range_insert_no_capacity<boost::container::dtl::insert_emplace_proxy<boost::container::new_allocator<std::pair<int,float>>,std::pair<int,float>*,unsigned_long&,float>>
                  ((vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>
                    *)&local_70,pvVar1,&local_50,1,&local_74,&local_80);
        if (local_70 == 0) {
LAB_0010d0dd:
          __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                        "reference boost::container::vec_iterator<std::pair<int, float> *, false>::operator*() const [Pointer = std::pair<int, float> *, IsConst = false]"
                       );
        }
      }
      boost::container::dtl::
      flat_tree_adopt_sequence_unique<boost::container::vector<boost::container::dtl::pair<int,float>,boost::container::new_allocator<boost::container::dtl::pair<int,float>>,void>,boost::container::dtl::flat_tree_value_compare<std::less<int>,boost::container::dtl::pair<int,float>,boost::container::dtl::select1st<int>>>
                (local_80 * 0x18 + *(long *)this,
                 local_48.
                 super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_80);
      local_80 = local_80 + 1;
    } while (local_80 <
             (ulong)(((long)local_48.
                            super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_48.
                            super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  std::
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void read_edges(FilteredEdgeRange const&r){
    neighbors.resize(num_vertices);
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
    init_neighbors_dense();
#endif
    // Use the raw sequence to avoid maintaining the order
    std::vector<typename Ngb_list::sequence_type> neighbors_seq(num_vertices);
    for(auto&&e : r){
      using std::get;
      Vertex u = get<0>(e);
      Vertex v = get<1>(e);
      Filtration_value f = get<2>(e);
      neighbors_seq[u].emplace_back(v, f);
      neighbors_seq[v].emplace_back(u, f);
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
      neighbors_dense(u,v)=f;
      neighbors_dense(v,u)=f;
#endif
    }
    for(std::size_t i=0;i<neighbors_seq.size();++i){
      neighbors_seq[i].emplace_back(i, -std::numeric_limits<Filtration_value>::infinity());
      neighbors[i].adopt_sequence(std::move(neighbors_seq[i])); // calls sort
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
      neighbors_dense(i,i)=-std::numeric_limits<Filtration_value>::infinity();
#endif
    }
  }